

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLimiter.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Code code)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = "Unknown code";
  if (code == TooManyRequests) {
    pcVar1 = "Too many requests (429)";
  }
  pcVar2 = "Ok (200)";
  if (code != Ok) {
    pcVar2 = pcVar1;
  }
  std::operator<<(os,pcVar2);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, HttpResult::Code code)
{
    const auto str =
        code == HttpResult::Code::Ok ? "Ok (200)" :
        code == HttpResult::Code::TooManyRequests ? "Too many requests (429)" :
        "Unknown code";
    os << str;
    return os;
}